

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objcomp.c
# Opt level: O2

void objaddsc(mcmcxdef *mctx,int sccnt,objnum objn)

{
  ushort *puVar1;
  ushort uVar2;
  ulong uVar3;
  int iVar4;
  undefined8 in_RAX;
  uchar *puVar5;
  int iVar6;
  undefined6 in_register_00000012;
  uint uVar7;
  objnum obj;
  ulong uVar8;
  ushort siz;
  undefined8 uStack_38;
  
  uVar8 = CONCAT62(in_register_00000012,objn) & 0xffffffff;
  uStack_38 = in_RAX;
  puVar5 = mcmlck(mctx,objn);
  uVar3 = uVar8 >> 8;
  uVar7 = (uint)CONCAT62(in_register_00000012,objn) & 0xff;
  uVar2 = *(ushort *)
           ((long)&mctx->mcmcxgl->mcmcxtab[mctx->mcmcxmtb[uVar3][uVar7] >> 8]->mcmosiz +
           (ulong)((mctx->mcmcxmtb[uVar3][uVar7] & 0xff) << 5));
  iVar6 = (uint)uVar2 - (uint)*(ushort *)(puVar5 + 8);
  iVar4 = sccnt * 2;
  obj = (objnum)uVar8;
  if (SBORROW4(iVar6,iVar4) != iVar6 + sccnt * -2 < 0) {
    uStack_38 = CONCAT26(*(ushort *)(puVar5 + 8) + ((short)iVar4 - uVar2) + 0x40,
                         (undefined6)uStack_38);
    puVar5 = objexp(mctx,obj,(ushort *)((long)&uStack_38 + 6));
  }
  if (*(short *)(puVar5 + 6) != 0) {
    memmove(puVar5 + (ulong)*(ushort *)(puVar5 + 4) * 2 + 0xe,
            puVar5 + (long)iVar4 + (ulong)*(ushort *)(puVar5 + 4) * 2 + 0xe,
            (size_t)(puVar5 + ((ulong)*(ushort *)(puVar5 + 8) -
                              (long)(puVar5 + (ulong)*(ushort *)(puVar5 + 4) * 2 + 0xe))));
  }
  *(short *)(puVar5 + 8) = *(short *)(puVar5 + 8) + (short)iVar4;
  puVar1 = &mctx->mcmcxgl->mcmcxtab[mctx->mcmcxmtb[uVar3][uVar7] >> 8]
            [(byte)mctx->mcmcxmtb[uVar3][uVar7]].mcmoflg;
  *puVar1 = *puVar1 | 1;
  mcmunlck(mctx,obj);
  return;
}

Assistant:

void objaddsc(mcmcxdef *mctx, int sccnt, objnum objn)
{
    objdef *o;
    ushort  siz;
    
    /* get lock on object */
    o = (objdef *)mcmlck(mctx, objn);
    
    /* make sure there's enough space, adding space if needed */
    if (mcmobjsiz(mctx, (mcmon)objn) - objfree(o) < 2 * sccnt)
    {
        siz = 64 + ((2 * sccnt + objfree(o)) -
                    mcmobjsiz(mctx, (mcmon)objn));
        o = objexp(mctx, objn, &siz);                  /* expand the object */
    }

    /* move properties, if any, above added superclasses */
    if (objnprop(o))
        memmove(objprp(o), ((uchar *)objprp(o)) + 2 * sccnt,
                (size_t)(((uchar *)o) + objfree(o) - (uchar *)objprp(o)));
    
    /* set new free pointer */
    objsfree(o, objfree(o) + 2 * sccnt);
    
    /* mark cache object modified and unlock it */
    mcmtch(mctx, objn);
    mcmunlck(mctx, objn);
}